

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O1

Vec_Int_t * Gia_ManGetStateAndCheckCex(Gia_Man_t *pAig,Abc_Cex_t *p,int iFrame)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int iVar8;
  Vec_Int_t *__ptr;
  int *piVar9;
  long lVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint local_48;
  
  iVar11 = pAig->nRegs;
  __ptr = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar8 = iVar11;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar8;
  if (iVar8 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar8 << 2);
  }
  __ptr->pArray = piVar9;
  if ((iFrame < 0) || (p->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= p->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x100,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  Gia_ManCleanMark0(pAig);
  iVar11 = pAig->nRegs;
  if (0 < iVar11) {
    iVar8 = 0;
    do {
      iVar13 = pAig->vCis->nSize;
      uVar14 = (iVar13 - iVar11) + iVar8;
      if (((int)uVar14 < 0) || (iVar13 <= (int)uVar14)) goto LAB_0060e9d2;
      iVar11 = pAig->vCis->pArray[uVar14];
      if (((long)iVar11 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0060e9b3;
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &pAig->pObjs[iVar11].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      iVar8 = iVar8 + 1;
      iVar11 = pAig->nRegs;
    } while (iVar8 < iVar11);
  }
  local_48 = p->nRegs;
  if (p->iFrame < 0) {
LAB_0060e92b:
    if (local_48 != p->nBits) {
      __assert_fail("iBit == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                    ,0x117,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
    }
    uVar14 = p->iPo;
    iVar11 = pAig->vCos->nSize;
    if (iVar11 - pAig->nRegs <= (int)uVar14) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if ((-1 < (int)uVar14) && ((int)uVar14 < iVar11)) {
      iVar11 = pAig->vCos->pArray[uVar14];
      if ((-1 < (long)iVar11) && (iVar11 < pAig->nObjs)) {
        if ((pAig->pObjs[iVar11].field_0x3 & 0x40) == 0) {
          if (__ptr->pArray != (int *)0x0) {
            free(__ptr->pArray);
            __ptr->pArray = (int *)0x0;
          }
          free(__ptr);
          __ptr = (Vec_Int_t *)0x0;
        }
        Gia_ManCleanMark0(pAig);
        return __ptr;
      }
LAB_0060e9b3:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
LAB_0060e9d2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar11 = 0;
  do {
    if ((iVar11 == iFrame) && (iVar8 = pAig->nRegs, 0 < iVar8)) {
      iVar13 = 0;
      do {
        iVar2 = pAig->vCis->nSize;
        uVar14 = (iVar2 - iVar8) + iVar13;
        if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_0060e9d2;
        iVar8 = pAig->vCis->pArray[uVar14];
        if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) goto LAB_0060e9b3;
        if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
        uVar14 = *(uint *)(pAig->pObjs + iVar8);
        uVar3 = __ptr->nSize;
        uVar4 = __ptr->nCap;
        if (uVar3 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (__ptr->pArray == (int *)0x0) {
              piVar9 = (int *)malloc(0x40);
            }
            else {
              piVar9 = (int *)realloc(__ptr->pArray,0x40);
            }
            __ptr->pArray = piVar9;
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar4 * 2;
            if (iVar8 <= (int)uVar4) goto LAB_0060e65e;
            if (__ptr->pArray == (int *)0x0) {
              piVar9 = (int *)malloc((ulong)uVar4 << 3);
            }
            else {
              piVar9 = (int *)realloc(__ptr->pArray,(ulong)uVar4 << 3);
            }
            __ptr->pArray = piVar9;
          }
          if (piVar9 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          __ptr->nCap = iVar8;
        }
LAB_0060e65e:
        __ptr->nSize = uVar3 + 1;
        __ptr->pArray[(int)uVar3] = uVar14 >> 0x1e & 1;
        iVar13 = iVar13 + 1;
        iVar8 = pAig->nRegs;
      } while (iVar13 < iVar8);
    }
    pVVar12 = pAig->vCis;
    uVar15 = (ulong)(uint)pVVar12->nSize;
    if (pAig->nRegs < pVVar12->nSize) {
      lVar10 = 0;
      do {
        if ((int)uVar15 <= lVar10) goto LAB_0060e9d2;
        lVar16 = (long)pVVar12->pArray[lVar10];
        if ((lVar16 < 0) || (pAig->nObjs <= pVVar12->pArray[lVar10])) goto LAB_0060e9b3;
        pGVar6 = pAig->pObjs;
        if (pGVar6 == (Gia_Obj_t *)0x0) break;
        *(ulong *)(pGVar6 + lVar16) =
             *(ulong *)(pGVar6 + lVar16) & 0xffffffffbfffffff |
             (ulong)(((uint)(&p[1].iPo)[(int)((ulong)local_48 + lVar10) >> 5] >>
                      ((byte)((ulong)local_48 + lVar10) & 0x1f) & 1) << 0x1e);
        lVar10 = lVar10 + 1;
        pVVar12 = pAig->vCis;
        uVar15 = (ulong)pVVar12->nSize;
      } while (lVar10 < (long)(uVar15 - (long)pAig->nRegs));
      local_48 = local_48 + (int)lVar10;
    }
    if (0 < pAig->nObjs) {
      lVar10 = 0;
      lVar16 = 0;
      do {
        pGVar6 = pAig->pObjs;
        if (pGVar6 == (Gia_Obj_t *)0x0) break;
        uVar15 = *(ulong *)(&pGVar6->field_0x0 + lVar10);
        if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
          *(ulong *)(&pGVar6->field_0x0 + lVar10) =
               uVar15 & 0xffffffff3fffffff |
               (ulong)((((uint)(uVar15 >> 0x3d) ^
                        *(uint *)((long)pGVar6 +
                                 (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3 + lVar10) >> 0x1e
                        ) & ((uint)(uVar15 >> 0x1d) & 7 ^
                            *(uint *)((long)pGVar6 +
                                     (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3 + lVar10)
                            >> 0x1e) & 1) << 0x1e);
        }
        lVar16 = lVar16 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar16 < pAig->nObjs);
    }
    pVVar12 = pAig->vCos;
    if (0 < pVVar12->nSize) {
      lVar10 = 0;
      do {
        iVar8 = pVVar12->pArray[lVar10];
        if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) goto LAB_0060e9b3;
        if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar6 = pAig->pObjs + iVar8;
        uVar14 = (uint)*(ulong *)pGVar6;
        *(ulong *)pGVar6 =
             *(ulong *)pGVar6 & 0xffffffffbfffffff |
             (ulong)((uVar14 * 2 ^ *(uint *)(pGVar6 + -(ulong)(uVar14 & 0x1fffffff))) & 0x40000000);
        lVar10 = lVar10 + 1;
        pVVar12 = pAig->vCos;
      } while (lVar10 < pVVar12->nSize);
    }
    if (iVar11 == p->iFrame) goto LAB_0060e92b;
    iVar8 = pAig->nRegs;
    if (0 < iVar8) {
      iVar13 = 0;
      do {
        iVar2 = pAig->vCos->nSize;
        uVar14 = (iVar2 - iVar8) + iVar13;
        if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_0060e9d2;
        iVar2 = pAig->vCos->pArray[uVar14];
        if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) goto LAB_0060e9b3;
        pGVar6 = pAig->pObjs;
        if (pGVar6 == (Gia_Obj_t *)0x0) break;
        iVar5 = pAig->vCis->nSize;
        uVar14 = (iVar5 - iVar8) + iVar13;
        if (((int)uVar14 < 0) || (iVar5 <= (int)uVar14)) goto LAB_0060e9d2;
        iVar8 = pAig->vCis->pArray[uVar14];
        lVar10 = (long)iVar8;
        if ((lVar10 < 0) || (pAig->nObjs <= iVar8)) goto LAB_0060e9b3;
        *(ulong *)(pGVar6 + lVar10) =
             *(ulong *)(pGVar6 + lVar10) & 0xffffffffbfffffff |
             (ulong)((uint)*(undefined8 *)(pGVar6 + iVar2) & 0x40000000);
        iVar13 = iVar13 + 1;
        iVar8 = pAig->nRegs;
      } while (iVar13 < iVar8);
    }
    bVar7 = p->iFrame <= iVar11;
    iVar11 = iVar11 + 1;
    if (bVar7) goto LAB_0060e92b;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManGetStateAndCheckCex( Gia_Man_t * pAig, Abc_Cex_t * p, int iFrame )
{
    Vec_Int_t * vInit = Vec_IntAlloc( Gia_ManRegNum(pAig) );
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( iFrame >= 0 && iFrame <= p->iFrame );
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = 0;//Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0, iBit = p->nRegs; i <= p->iFrame; i++ )
    {
        if ( i == iFrame )
        {
            Gia_ManForEachRo( pAig, pObjRo, k )
                Vec_IntPush( vInit, pObjRo->fMark0 );
        }
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    if ( RetValue != 1 )
        Vec_IntFreeP( &vInit );
    Gia_ManCleanMark0(pAig);
    return vInit;
}